

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O3

void gai_print_range(char *pre,int ndim,Integer *lo,Integer *hi,char *post)

{
  ulong uVar1;
  
  printf("%s[",pre);
  if (0 < ndim) {
    uVar1 = 0;
    do {
      printf("%ld:%ld",lo[uVar1],hi[uVar1]);
      if (ndim - 1 == uVar1) {
        printf("] %s","\n");
      }
      else {
        putchar(0x2c);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)ndim != uVar1);
  }
  return;
}

Assistant:

static void gai_print_range(char *pre,int ndim, 
                            Integer lo[], Integer hi[], char* post)
{
        int i;

        printf("%s[",pre);
        for(i=0;i<ndim;i++){
                printf("%ld:%ld",(long)lo[i],(long)hi[i]);
                if(i==ndim-1)printf("] %s",post);
                else printf(",");
        }
}